

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkIsAcyclicWithBoxes(Abc_Ntk_t *pNtk)

{
  FILE *pFVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int local_20;
  int local_1c;
  int i;
  int fAcyclic;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkIncrementTravId(pNtk);
  Abc_NtkIncrementTravId(pNtk);
  local_1c = 1;
  local_20 = 0;
  do {
    iVar2 = Abc_NtkPoNum(pNtk);
    if (iVar2 <= local_20) {
LAB_00aca881:
      if (local_1c != 0) {
        for (local_20 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_20 < iVar2;
            local_20 = local_20 + 1) {
          pAVar3 = Abc_NtkBox(pNtk,local_20);
          iVar2 = Abc_ObjIsLatch(pAVar3);
          if (iVar2 != 0) {
            pAVar3 = Abc_NtkBox(pNtk,local_20);
            pAVar3 = Abc_ObjFanin0(pAVar3);
            pAVar3 = Abc_ObjFanin0(pAVar3);
            _i = Abc_ObjFanin0Ntk(pAVar3);
            iVar2 = Abc_ObjIsBo(_i);
            if (iVar2 != 0) {
              _i = Abc_ObjFanin0(_i);
            }
            iVar2 = Abc_NodeIsTravIdPrevious(_i);
            if ((iVar2 == 0) &&
               (local_1c = Abc_NtkIsAcyclicWithBoxes_rec(_i), pFVar1 = _stdout, local_1c == 0)) {
              pAVar3 = Abc_ObjFanout0(_i);
              pcVar4 = Abc_ObjName(pAVar3);
              fprintf(pFVar1," PO \"%s\"\n",pcVar4);
              return 0;
            }
          }
        }
      }
      return local_1c;
    }
    pAVar3 = Abc_NtkPo(pNtk,local_20);
    pAVar3 = Abc_ObjFanin0(pAVar3);
    _i = Abc_ObjFanin0Ntk(pAVar3);
    iVar2 = Abc_ObjIsBo(_i);
    if (iVar2 != 0) {
      _i = Abc_ObjFanin0(_i);
    }
    iVar2 = Abc_NodeIsTravIdPrevious(_i);
    if ((iVar2 == 0) &&
       (local_1c = Abc_NtkIsAcyclicWithBoxes_rec(_i), pFVar1 = _stdout, local_1c == 0)) {
      pAVar3 = Abc_ObjFanout0(_i);
      pcVar4 = Abc_ObjName(pAVar3);
      fprintf(pFVar1," PO \"%s\"\n",pcVar4);
      goto LAB_00aca881;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int Abc_NtkIsAcyclicWithBoxes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Abc_NtkIncrementTravId( pNtk );   
    Abc_NtkIncrementTravId( pNtk );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
        if ( Abc_ObjIsBo(pNode) )
            pNode = Abc_ObjFanin0(pNode);
        if ( Abc_NodeIsTravIdPrevious(pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pNode)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " PO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        break;
    }
    if ( fAcyclic )
    {
        Abc_NtkForEachLatchInput( pNtk, pNode, i )
        {
            pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
            if ( Abc_ObjIsBo(pNode) )
                pNode = Abc_ObjFanin0(pNode);
            if ( Abc_NodeIsTravIdPrevious(pNode) )
                continue;
            // traverse the output logic cone
            if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pNode)) )
                continue;
            // stop as soon as the first loop is detected
            fprintf( stdout, " PO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            break;
        }
    }
    return fAcyclic;
}